

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen_unchanged.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  FILE *pFVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  undefined1 local_48 [8];
  zip_error_t error;
  int err;
  zip_source_t *zs;
  zip_t *za;
  char *archive;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    lVar5 = zip_open(pcVar1,1,(undefined1 *)((long)&error.str + 4));
    pcVar2 = teststr;
    if (lVar5 == 0) {
      zip_error_init_with_code(local_48,error.str._4_4_);
      pFVar3 = _stderr;
      uVar6 = zip_error_strerror(local_48);
      fprintf(pFVar3,"can\'t open zip archive \'%s\': %s\n",pcVar1,uVar6);
      zip_error_fini(local_48);
      argv_local._4_4_ = 1;
    }
    else {
      sVar7 = strlen(teststr);
      lVar8 = zip_source_buffer(lVar5,pcVar2,sVar7,0);
      pFVar3 = _stderr;
      if (lVar8 == 0) {
        uVar6 = zip_strerror(lVar5);
        fprintf(pFVar3,"can\'t create zip_source from buffer: %s\n",uVar6);
        exit(1);
      }
      lVar9 = zip_add(lVar5,file,lVar8);
      pFVar3 = _stderr;
      pcVar2 = file;
      if (lVar9 == -1) {
        uVar6 = zip_strerror(lVar5);
        fprintf(pFVar3,"can\'t add file \'%s\': %s\n",pcVar2,uVar6);
        zip_source_free(lVar8);
        zip_close(lVar5);
        argv_local._4_4_ = 1;
      }
      else {
        lVar8 = zip_fopen(lVar5,file,8);
        pFVar3 = _stderr;
        pcVar2 = file;
        if (lVar8 == 0) {
          uVar6 = zip_strerror(lVar5);
          fprintf(pFVar3,"can\'t zip_fopen file \'%s\': %s\n",pcVar2,uVar6);
          zip_discard(lVar5);
          argv_local._4_4_ = 1;
        }
        else {
          iVar4 = zip_close(lVar5);
          pFVar3 = _stderr;
          if (iVar4 == -1) {
            uVar6 = zip_strerror(lVar5);
            fprintf(pFVar3,"can\'t close zip archive \'%s\': %s\n",pcVar1,uVar6);
            argv_local._4_4_ = 1;
          }
          else {
            argv_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"usage: %s archive\n",*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[]) {
    const char *archive;
    zip_t *za;
    zip_source_t *zs;
    int err;

    if (argc != 2) {
	fprintf(stderr, "usage: %s archive\n", argv[0]);
	return 1;
    }

    archive = argv[1];

    if ((za = zip_open(archive, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "can't open zip archive '%s': %s\n", archive, zip_error_strerror(&error));
	zip_error_fini(&error);
	return 1;
    }

    if ((zs = zip_source_buffer(za, teststr, strlen(teststr), 0)) == NULL) {
	fprintf(stderr, "can't create zip_source from buffer: %s\n", zip_strerror(za));
	exit(1);
    }

    if (zip_add(za, file, zs) == -1) {
	fprintf(stderr, "can't add file '%s': %s\n", file, zip_strerror(za));
	(void)zip_source_free(zs);
	(void)zip_close(za);
	return 1;
    }

    if (zip_fopen(za, file, ZIP_FL_UNCHANGED) == NULL) {
	fprintf(stderr, "can't zip_fopen file '%s': %s\n", file, zip_strerror(za));
	(void)zip_discard(za);
	return 1;
    }

    if (zip_close(za) == -1) {
	fprintf(stderr, "can't close zip archive '%s': %s\n", archive, zip_strerror(za));
	return 1;
    }

    return 0;
}